

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

void test_seq_oc(void)

{
  clock_t cVar1;
  clock_t cVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  double local_c48;
  dsfmt_t local_c38;
  
  dsfmt_chk_init_gen_rand(&local_c38,0x4d2,0x4de1);
  iVar8 = 0;
  local_c48 = 0.0;
  lVar6 = 0;
  do {
    cVar1 = clock();
    iVar5 = 0;
    do {
      iVar7 = 50000;
      do {
        if (0x17d < local_c38.idx) {
          dsfmt_gen_rand_all(&local_c38);
          local_c38.idx = 0;
        }
        lVar3 = (long)local_c38.idx;
        local_c38.idx = local_c38.idx + 1;
        local_c48 = local_c48 + (2.0 - local_c38.status[0].d[lVar3]);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 2000);
    cVar2 = clock();
    lVar6 = (lVar6 - cVar1) + cVar2;
    iVar8 = iVar8 + 1;
  } while (iVar8 != 10);
  iVar8 = 0;
  printf("ST SEQ (0, 1] 1 AVE:%4lums.\n",(ulong)(lVar6 * 100) / 1000000);
  lVar6 = 0;
  do {
    cVar1 = clock();
    iVar5 = 0;
    do {
      lVar3 = 0;
      do {
        if (0x17d < local_c38.idx) {
          dsfmt_gen_rand_all(&local_c38);
          local_c38.idx = 0;
        }
        lVar4 = (long)local_c38.idx;
        local_c38.idx = local_c38.idx + 1;
        *(double *)((long)dummy + lVar3) = 2.0 - local_c38.status[0].d[lVar4];
        lVar3 = lVar3 + 8;
      } while (lVar3 != 400000);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 2000);
    cVar2 = clock();
    lVar6 = (lVar6 - cVar1) + cVar2;
    iVar8 = iVar8 + 1;
  } while (iVar8 != 10);
  lVar3 = 0;
  do {
    local_c48 = local_c48 + *(double *)((long)dummy + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 400000);
  printf("ST SEQ (0, 1] 2 AVE:%4lums.\n",(ulong)(lVar6 * 100) / 1000000);
  printf("total = %f\n",local_c48);
  return;
}

Assistant:

static void test_seq_oc(void) {
    uint32_t i, j, k;
    uint64_t clo;
    uint64_t sum;
    double *array = (double *)dummy;
    double r;
    double total = 0;
    dsfmt_t dsfmt;
#if 0
    dsfmt_gv_init_gen_rand(1234);
    sum = 0;
    r = 0;
    for (i = 0; i < 10; i++) {
	clo = clock();
	for (j = 0; j < TIC_COUNT; j++) {
	    for (k = 0; k < NUM_RANDS; k++) {
		r += dsfmt_gv_genrand_open_close();
	    }
	}
	clo = clock() - clo;
	sum += clo;
    }
    total = r;
    printf("GL SEQ (0, 1] 1 AVE:%4" PRIu64"ms.\n",
	   (sum * 100)  / CLOCKS_PER_SEC);
    sum = 0;
    for (i = 0; i < 10; i++) {
	clo = clock();
	for (j = 0; j < TIC_COUNT; j++) {
	    for (k = 0; k < NUM_RANDS; k++) {
		array[k] = dsfmt_gv_genrand_open_close();
	    }
	}
	clo = clock() - clo;
	sum += clo;
    }
    for (k = 0; k < NUM_RANDS; k++) {
	total += array[k];
    }
    printf("GL SEQ (0, 1] 2 AVE:%4" PRIu64"ms.\n",
	   (sum * 100)  / CLOCKS_PER_SEC);
#endif
    dsfmt_init_gen_rand(&dsfmt, 1234);
    sum = 0;
    r = 0;
    for (i = 0; i < 10; i++) {
        clo = clock();
        for (j = 0; j < TIC_COUNT; j++) {
            for (k = 0; k < NUM_RANDS; k++) {
                r += dsfmt_genrand_open_close(&dsfmt);
            }
        }
        clo = clock() - clo;
        sum += clo;
    }
    total += r;
    printf("ST SEQ (0, 1] 1 AVE:%4" PRIu64"ms.\n",
           (sum * 100)  / CLOCKS_PER_SEC);
    sum = 0;
    for (i = 0; i < 10; i++) {
        clo = clock();
        for (j = 0; j < TIC_COUNT; j++) {
            for (k = 0; k < NUM_RANDS; k++) {
                array[k] = dsfmt_genrand_open_close(&dsfmt);
            }
        }
        clo = clock() - clo;
        sum += clo;
    }
    for (k = 0; k < NUM_RANDS; k++) {
        total += array[k];
    }
    printf("ST SEQ (0, 1] 2 AVE:%4" PRIu64"ms.\n",
           (sum * 100)  / CLOCKS_PER_SEC);
    printf("total = %f\n", total);
}